

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

Span * __thiscall tcmalloc::PageHeap::New(PageHeap *this,uint64_t n)

{
  bool bVar1;
  Span *pSVar2;
  uint64_t uVar3;
  Span *span;
  lock_guard<std::mutex> guard;
  uint64_t n_local;
  PageHeap *this_local;
  
  guard._M_device = (mutex_type *)n;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&span,&this->lock);
  pSVar2 = SearchSmallAndLarge(this,(uint64_t)guard._M_device);
  if (pSVar2 == (Span *)0x0) {
    if (((((this->stat).normal_bytes == 0) || ((this->stat).returned_bytes == 0)) ||
        ((this->stat).normal_bytes + (this->stat).returned_bytes <= (this->stat).system_bytes >> 2))
       || ((uVar3 = ReleaseNormalSpans(this,0x7fffffff), uVar3 == 0 ||
           (pSVar2 = SearchSmallAndLarge(this,(uint64_t)guard._M_device), pSVar2 == (Span *)0x0))))
    {
      bVar1 = GrowHeap(this,(uint64_t)guard._M_device);
      if ((bVar1) &&
         (pSVar2 = SearchSmallAndLarge(this,(uint64_t)guard._M_device), pSVar2 != (Span *)0x0)) {
        this_local = (PageHeap *)Carve(this,pSVar2,(uint64_t)guard._M_device);
      }
      else {
        this_local = (PageHeap *)0x0;
      }
    }
    else {
      this_local = (PageHeap *)Carve(this,pSVar2,(uint64_t)guard._M_device);
    }
  }
  else {
    this_local = (PageHeap *)Carve(this,pSVar2,(uint64_t)guard._M_device);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&span);
  return (Span *)this_local;
}

Assistant:

Span* New(uint64_t n) {
        std::lock_guard<std::mutex> guard(lock);
        Span* span = nullptr;
        span = SearchSmallAndLarge(n);
        if (span != nullptr) {
            return Carve(span, n);
        }

        // 没找到，但是有很多空闲内存，尝试合并碎片之后再找。
        if ( stat.normal_bytes != 0 && stat.returned_bytes != 0 &&
        (stat.normal_bytes + stat.returned_bytes) > (stat.system_bytes/4) &&
                (ReleaseNormalSpans(0x7fffffff) > 0) )
        {
            span = SearchSmallAndLarge(n);
            if (span != nullptr) {
                return Carve(span, n);
            }
        }

        if (GrowHeap(n)) {
            span = SearchSmallAndLarge(n);
            if (span != nullptr) {
                return Carve(span, n);
            }
        }
        return nullptr;
    }